

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeProxyPrototype
               (DynamicObject *proxyPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  undefined8 in_RAX;
  uint uVar1;
  
  uVar1 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,proxyPrototype,mode,1,0);
  (*(proxyPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (proxyPrototype,0x67,
             (((((proxyPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).proxyConstructor.ptr,6,0,0,(ulong)uVar1 << 0x20);
  DynamicObject::SetHasNoEnumerableProperties(proxyPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeProxyPrototype(DynamicObject* proxyPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(proxyPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = proxyPrototype->GetLibrary();
        library->AddMember(proxyPrototype, PropertyIds::constructor, library->proxyConstructor);

        proxyPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }